

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTrait.h
# Opt level: O3

void __thiscall MeshLib::CFaceTrait::~CFaceTrait(CFaceTrait *this)

{
  pointer pcVar1;
  
  (this->super_Trait)._vptr_Trait = (_func_int **)&PTR__Trait_00119c68;
  pcVar1 = (this->super_Trait).m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->super_Trait).m_string.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

Point & fnormal() { return f_normal; }